

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<float> fmt::v9::detail::dragonbox::to_decimal<float>(float x)

{
  uint32_t uVar1;
  bool bVar2;
  compute_mul_parity_result cVar3;
  uint uVar4;
  int iVar5;
  carrier_uint cVar6;
  int iVar7;
  uint64_t uVar8;
  compute_mul_result cVar9;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  char cVar18;
  cache_entry_type cache;
  ulong local_48;
  ulong local_40;
  uint32_t dist;
  
  uVar14 = (uint)x & 0x7fffff;
  uVar12 = (uint)x >> 0x17 & 0xff;
  if (uVar12 == 0) {
    uVar12 = 0xffffff6b;
    if (uVar14 == 0) {
      uVar11 = 0;
      uVar17 = 0;
      goto LAB_001c88a1;
    }
LAB_001c867e:
    uVar4 = floor_log10_pow2(uVar12);
    uVar11 = (ulong)uVar4;
    uVar8 = cache_accessor<float>::get_cached_power(1 - uVar4);
    cache = uVar8;
    iVar5 = floor_log2_pow10(1 - uVar4);
    iVar5 = iVar5 + uVar12;
    local_48 = (ulong)(uVar14 * 2);
    cVar9 = cache_accessor<float>::compute_mul(uVar14 * 2 + 1 << ((byte)iVar5 & 0x1f),&cache);
    cVar6 = cVar9.result;
    uVar17 = (ulong)cVar9 & 0xffffffff;
    iVar16 = (int)(uVar17 / 100);
    iVar7 = (int)(uVar17 / 100);
    uVar12 = iVar7 * -100 + cVar6;
    uVar15 = (uint)(uVar8 >> (~(byte)iVar5 & 0x3f));
    if (uVar12 < uVar15) {
      if ((uVar12 != 0) || ((uVar14 & 1 & cVar9._4_4_) == 0)) {
LAB_001c8743:
        if (cVar6 < 100) {
LAB_001c88c8:
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                      ,0x480,"");
        }
        iVar5 = uVar4 - 1;
        uVar17 = uVar17 / 100;
        do {
          uVar11 = uVar17;
          iVar7 = (int)uVar11;
          uVar12 = iVar7 * 0x40000000 | (uint)(iVar7 * -0x3d70a3d7) >> 2;
          iVar5 = iVar5 + 2;
          uVar17 = (ulong)uVar12;
        } while (uVar12 < 0x28f5c29);
        uVar12 = (uint)(iVar7 * -0x33333333) >> 1 | (uint)((iVar7 * -0x33333333 & 1U) != 0) << 0x1f;
        bVar2 = uVar12 < 0x1999999a;
        uVar17 = (ulong)uVar12;
        if (!bVar2) {
          uVar17 = uVar11;
        }
        goto LAB_001c889e;
      }
      iVar16 = iVar7 + -1;
      uVar12 = 100;
    }
    else if (uVar12 <= uVar15) {
      local_40 = uVar17;
      cVar3 = cache_accessor<float>::compute_mul_parity((int)local_48 - 1,&cache,iVar5);
      cVar6 = (carrier_uint)local_40;
      if ((~uVar14 & (uint)((ushort)cVar3 >> 8) & 1) != 0 || ((ushort)cVar3 & 1) != 0)
      goto LAB_001c8743;
    }
    uVar12 = uVar12 - (uVar15 >> 1);
    dist = uVar12 + 5;
    bVar2 = check_divisibility_and_divide_by_pow10<1>(&dist);
    uVar1 = dist;
    uVar14 = iVar16 * 10 + dist;
    uVar17 = (ulong)uVar14;
    if (bVar2) {
      cVar3 = cache_accessor<float>::compute_mul_parity((carrier_uint)local_48,&cache,iVar5);
      if ((uVar12 & 1) == ((ushort)cVar3 & 1)) {
        uVar17 = (ulong)(uVar14 - (uVar1 & (ushort)cVar3 >> 8 & 1));
      }
      else {
        uVar17 = (ulong)(uVar14 - 1);
      }
    }
  }
  else {
    uVar12 = uVar12 - 0x96;
    if (uVar14 != 0) {
      uVar14 = uVar14 | 0x800000;
      goto LAB_001c867e;
    }
    uVar14 = floor_log10_pow2_minus_log10_4_over_3(uVar12);
    uVar11 = (ulong)uVar14;
    iVar5 = floor_log2_pow10(-uVar14);
    cVar18 = (char)iVar5 + (char)uVar12;
    uVar8 = cache_accessor<float>::get_cached_power(-uVar14);
    bVar10 = 0x28 - cVar18;
    uVar13 = (uVar8 >> 0x18) + uVar8 >> (bVar10 & 0x3f);
    uVar4 = (uint)((uVar12 & 0xfffffffe) != 2) + (int)(uVar8 - (uVar8 >> 0x19) >> (bVar10 & 0x3f));
    uVar17 = (uVar13 & 0xffffffff) / 10;
    if ((uint)((int)uVar17 * 10) < uVar4) {
      uVar14 = (int)(uVar8 >> (0x27U - cVar18 & 0x3f)) + 1U >> 1;
      if (uVar12 == 0xffffffdd) {
        uVar17 = (ulong)(uVar14 & 0xfffffffe);
      }
      else {
        uVar17 = (ulong)(uVar14 + (uVar14 < uVar4));
      }
      goto LAB_001c88a1;
    }
    if ((uint)uVar13 < 10) goto LAB_001c88c8;
    iVar5 = uVar14 - 1;
    do {
      uVar11 = uVar17;
      iVar7 = (int)uVar11;
      uVar12 = iVar7 * 0x40000000 | (uint)(iVar7 * -0x3d70a3d7) >> 2;
      iVar5 = iVar5 + 2;
      uVar17 = (ulong)uVar12;
    } while (uVar12 < 0x28f5c29);
    uVar12 = (uint)(iVar7 * -0x33333333) >> 1 | (uint)((iVar7 * -0x33333333 & 1U) != 0) << 0x1f;
    bVar2 = uVar12 < 0x1999999a;
    uVar17 = (ulong)uVar12;
    if (!bVar2) {
      uVar17 = uVar11;
    }
LAB_001c889e:
    uVar11 = (ulong)(iVar5 + (uint)bVar2);
  }
LAB_001c88a1:
  return (decimal_fp<float>)(uVar17 | uVar11 << 0x20);
}

Assistant:

static uint64_t get_cached_power(int k) noexcept {
    FMT_ASSERT(k >= float_info<float>::min_k && k <= float_info<float>::max_k,
               "k is out of range");
    static constexpr const uint64_t pow10_significands[] = {
        0x81ceb32c4b43fcf5, 0xa2425ff75e14fc32, 0xcad2f7f5359a3b3f,
        0xfd87b5f28300ca0e, 0x9e74d1b791e07e49, 0xc612062576589ddb,
        0xf79687aed3eec552, 0x9abe14cd44753b53, 0xc16d9a0095928a28,
        0xf1c90080baf72cb2, 0x971da05074da7bef, 0xbce5086492111aeb,
        0xec1e4a7db69561a6, 0x9392ee8e921d5d08, 0xb877aa3236a4b44a,
        0xe69594bec44de15c, 0x901d7cf73ab0acda, 0xb424dc35095cd810,
        0xe12e13424bb40e14, 0x8cbccc096f5088cc, 0xafebff0bcb24aaff,
        0xdbe6fecebdedd5bf, 0x89705f4136b4a598, 0xabcc77118461cefd,
        0xd6bf94d5e57a42bd, 0x8637bd05af6c69b6, 0xa7c5ac471b478424,
        0xd1b71758e219652c, 0x83126e978d4fdf3c, 0xa3d70a3d70a3d70b,
        0xcccccccccccccccd, 0x8000000000000000, 0xa000000000000000,
        0xc800000000000000, 0xfa00000000000000, 0x9c40000000000000,
        0xc350000000000000, 0xf424000000000000, 0x9896800000000000,
        0xbebc200000000000, 0xee6b280000000000, 0x9502f90000000000,
        0xba43b74000000000, 0xe8d4a51000000000, 0x9184e72a00000000,
        0xb5e620f480000000, 0xe35fa931a0000000, 0x8e1bc9bf04000000,
        0xb1a2bc2ec5000000, 0xde0b6b3a76400000, 0x8ac7230489e80000,
        0xad78ebc5ac620000, 0xd8d726b7177a8000, 0x878678326eac9000,
        0xa968163f0a57b400, 0xd3c21bcecceda100, 0x84595161401484a0,
        0xa56fa5b99019a5c8, 0xcecb8f27f4200f3a, 0x813f3978f8940985,
        0xa18f07d736b90be6, 0xc9f2c9cd04674edf, 0xfc6f7c4045812297,
        0x9dc5ada82b70b59e, 0xc5371912364ce306, 0xf684df56c3e01bc7,
        0x9a130b963a6c115d, 0xc097ce7bc90715b4, 0xf0bdc21abb48db21,
        0x96769950b50d88f5, 0xbc143fa4e250eb32, 0xeb194f8e1ae525fe,
        0x92efd1b8d0cf37bf, 0xb7abc627050305ae, 0xe596b7b0c643c71a,
        0x8f7e32ce7bea5c70, 0xb35dbf821ae4f38c, 0xe0352f62a19e306f};
    return pow10_significands[k - float_info<float>::min_k];
  }